

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

nh_log_status nh_get_savegame_status(int fd,nh_game_info *gi)

{
  boolean bVar1;
  schar sVar2;
  int iVar3;
  int32_t iVar4;
  ssize_t sVar5;
  __off_t _Var6;
  bool bVar7;
  undefined1 local_2aa0 [8];
  nh_topten_entry tt;
  unsigned_long_long starttime;
  long sg_moves;
  flag sg_flags;
  you sg_you;
  undefined1 auStack_2110 [3];
  boolean game_inited;
  nh_log_status ret;
  memfile mf;
  undefined1 local_148 [4];
  uint playmode;
  uint seed;
  uint endpos;
  uint savepos;
  int v3;
  int v2;
  int v1;
  int n2;
  int n;
  char algn [16];
  char gend [16];
  char race [16];
  char role [16];
  char encplname [64];
  char local_a0 [8];
  char status [8];
  char header [128];
  nh_game_info *gi_local;
  int fd_local;
  
  sg_you.initgend._3_1_ = dungeon_topology.d_wiz1_level.dlevel != '\0';
  lseek(fd,0,0);
  sVar5 = read(fd,status,0x7f);
  if (sVar5 < 1) {
    gi_local._4_4_ = LS_INVALID;
  }
  else {
    iVar3 = __isoc99_sscanf(status,"NHGAME %4s %x %*8s %d.%d.%d\n%n",local_a0,&seed,&v3,&savepos,
                            &endpos,&v1);
    if (iVar3 < 5) {
      gi_local._4_4_ = LS_INVALID;
    }
    else {
      v2 = sscan_llx(status + v1,(unsigned_long_long *)(tt.entrytxt + 0xfc));
      if (v2 == 0) {
        gi_local._4_4_ = LS_INVALID;
      }
      else {
        v1 = v2 + v1;
        iVar3 = __isoc99_sscanf(status + v1,"%x %x %64s %16s %16s %16s %16s",local_148,
                                (undefined1 *)((long)mf.tags + 0x1f84),role + 8,race + 8,gend + 8,
                                algn + 8,&n2);
        if (iVar3 < 7) {
          gi_local._4_4_ = LS_INVALID;
        }
        else {
          _Var6 = lseek(fd,0,2);
          playmode = (uint)_Var6;
          iVar3 = strcmp(local_a0,"done");
          if (iVar3 == 0) {
            sg_you.initalign = 1;
          }
          else {
            iVar3 = strcmp(local_a0,"inpr");
            if (iVar3 == 0) {
              sg_you.initalign = -2;
            }
            else {
              iVar3 = strcmp(local_a0,"save");
              if (iVar3 != 0) {
                return LS_INVALID;
              }
              sg_you.initalign = 0;
            }
          }
          if ((sg_you.initalign == 0) && (playmode <= seed)) {
            sg_you.initalign = -2;
          }
          bVar1 = lock_fd(fd,0);
          if (bVar1 == '\0') {
            sg_you.initalign = 2;
          }
          unlock_fd(fd);
          if (gi == (nh_game_info *)0x0) {
            gi_local._4_4_ = sg_you.initalign;
          }
          else {
            memset(gi,0,0x1c0);
            gi->playmode = mf.tags[0x3f0]._4_4_;
            base64_decode(role + 8,gi->name);
            race[8] = lowc(race[8]);
            strcpy(gi->plrole,race + 8);
            strcpy(gi->plrace,gend + 8);
            strcpy(gi->plgend,algn + 8);
            strcpy(gi->plalign,(char *)&n2);
            if ((sg_you.initalign == -2) || (sg_you.initalign == 2)) {
              gi_local._4_4_ = sg_you.initalign;
            }
            else {
              iVar3 = exit_jmp_buf_valid + 1;
              bVar7 = exit_jmp_buf_valid == 0;
              exit_jmp_buf_valid = iVar3;
              if ((bVar7) && (iVar3 = __sigsetjmp(exit_jmp_buf,1), iVar3 != 0)) {
                gi_local._4_4_ = LS_CRASHED;
              }
              else {
                lseek(fd,(ulong)seed,0);
                if (sg_you.initalign == 0) {
                  mf.buf._4_4_ = 0;
                  _auStack_2110 = loadfile(fd,(int *)&mf);
                  if (_auStack_2110 == (char *)0x0) {
                    return LS_SAVED;
                  }
                  bVar1 = uptodate((memfile *)auStack_2110,(char *)0x0);
                  if (bVar1 == '\0') {
                    free(_auStack_2110);
                    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
                    return LS_CRASHED;
                  }
                  restore_flags((memfile *)auStack_2110,(flag *)&sg_moves);
                  restore_you((memfile *)auStack_2110,(you *)&sg_flags.ascet);
                  iVar4 = mread32((memfile *)auStack_2110);
                  free(_auStack_2110);
                  if (sg_you.initgend._3_1_ == '\0') {
                    dlb_init();
                    init_dungeons();
                  }
                  sVar2 = depth((d_level *)&sg_you);
                  gi->depth = (int)sVar2;
                  gi->moves = iVar4;
                  gi->level_desc[0] = '\0';
                  gi->has_amulet = (byte)sg_you.udg_cnt & 1;
                  sVar2 = depth((d_level *)&sg_you);
                  topten_level_name((int)sg_you.ux,(int)sVar2,gi->level_desc);
                  if (sg_you.initgend._3_1_ == '\0') {
                    free_dungeon();
                    dlb_cleanup();
                  }
                }
                else if (sg_you.initalign == 1) {
                  read_log_toptenentry(fd,(nh_topten_entry *)local_2aa0);
                  gi->moves = tt.deathdate;
                  gi->depth = tt.rank;
                  strncpy(gi->death,tt.name + 0x18,0x100);
                }
                exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
                gi_local._4_4_ = sg_you.initalign;
              }
            }
          }
        }
      }
    }
  }
  return gi_local._4_4_;
}

Assistant:

enum nh_log_status nh_get_savegame_status(int fd, struct nh_game_info *gi)
{
    char header[128], status[8], encplname[PL_NSIZ * 2];
    char role[PLRBUFSZ], race[PLRBUFSZ], gend[PLRBUFSZ], algn[PLRBUFSZ];
    int n, n2, v1, v2, v3;
    unsigned int savepos, endpos, seed, playmode;
    struct memfile mf;
    enum nh_log_status ret;
    boolean game_inited = (wiz1_level.dlevel != 0);
    struct you sg_you;
    struct flag sg_flags;
    long sg_moves;
    unsigned long long starttime;

    lseek(fd, 0, SEEK_SET);
    if (read(fd, header, 127) <= 0) return LS_INVALID;
    header[127] = '\0';

    if (sscanf(header, "NHGAME %4s %x %*8s %d.%d.%d\n%n",
	       status, &savepos, &v1, &v2, &v3, &n) < 5)
	return LS_INVALID;
    n2 = sscan_llx(header + n, &starttime);
    if (!n2) return LS_INVALID;
    n += n2;
    if (sscanf(header + n, "%x %x %64s %16s %16s %16s %16s",
	       &seed, &playmode, encplname, role, race, gend, algn) < 7)
	return LS_INVALID;

    endpos = lseek(fd, 0, SEEK_END);
    if (!strcmp(status, "done"))
	ret = LS_DONE;
    else if (!strcmp(status, "inpr"))
	ret = LS_CRASHED;
    else if (!strcmp(status, "save"))
	ret = LS_SAVED;
    else
	return LS_INVALID;

    if (ret == LS_SAVED && endpos <= savepos)
	ret = LS_CRASHED;

    /* if we can't lock the file, it's in use */
    if (!lock_fd(fd, 0))
	ret = LS_IN_PROGRESS;
    unlock_fd(fd); /* don't need the lock, we're not going to write */

    if (!gi)
	return ret;
    
    memset(gi, 0, sizeof(struct nh_game_info));
    gi->playmode = playmode;
    base64_decode(encplname, gi->name);
    role[0] = lowc(role[0]);
    strcpy(gi->plrole, role);
    strcpy(gi->plrace, race);
    strcpy(gi->plgend, gend);
    strcpy(gi->plalign, algn);
    
    if (ret == LS_CRASHED || ret == LS_IN_PROGRESS)
	return ret;
    
    if (!api_entry_checkpoint())
	/* something went wrong, hopefully it isn't so bad that replay won't work */
	return LS_CRASHED;

    lseek(fd, savepos, SEEK_SET);
    if (ret == LS_SAVED) {
	mf.pos = 0;
	mf.buf = loadfile(fd, &mf.len);
	if (!mf.buf)
	    return 0;
	
	if (!uptodate(&mf, NULL)) {
	    free(mf.buf);
	    api_exit();
	    return LS_CRASHED; /* probably still a valid game */
	}
	
	restore_flags(&mf, &sg_flags);
	restore_you(&mf, &sg_you);
	sg_moves = mread32(&mf);
	free(mf.buf);
	
	/* make sure topten_level_name can work correctly */
	if (!game_inited) {
	    dlb_init();
	    init_dungeons();
	}
	
	gi->depth = depth(&sg_you.uz);
	gi->moves = sg_moves;
	gi->level_desc[0] = '\0';
	gi->has_amulet = sg_you.uhave.amulet;
	topten_level_name(sg_you.uz.dnum, depth(&sg_you.uz), gi->level_desc);
	
	if (!game_inited) {
	    free_dungeon();
	    dlb_cleanup();
	}
    } else if (ret == LS_DONE) {
	struct nh_topten_entry tt;
	
	read_log_toptenentry(fd, &tt);
	gi->moves = tt.moves;
	gi->depth = tt.maxlvl;
	strncpy(gi->death, tt.death, BUFSZ);
    }
    
    api_exit();
    
    return ret;
}